

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
mxx::all2all<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 vector<int,_std::allocator<int>_> *msgs,comm *comm)

{
  ulong uVar1;
  pointer msgs_00;
  int iVar2;
  
  msgs_00 = (msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  uVar1 = (long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)msgs_00;
  iVar2 = comm->m_size;
  if ((int)((long)((ulong)(uint)((int)(uVar1 >> 2) >> 0x1f) << 0x20 | uVar1 >> 2 & 0xffffffff) %
           (long)iVar2) != 0) {
    assert_fail("(int)msgs.size() % comm.size() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x4b2,"all2all");
    msgs_00 = (msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    iVar2 = comm->m_size;
    uVar1 = (long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)msgs_00;
  }
  all2all<int>(__return_storage_ptr__,msgs_00,(ulong)((long)uVar1 >> 2) / (ulong)(long)iVar2,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const std::vector<T>& msgs, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT((int)msgs.size() % comm.size() == 0);
    size_t size = msgs.size() / comm.size();
    std::vector<T> result = all2all(&msgs[0], size, comm);
    return result;
}